

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O2

shared_ptr<helics::Core>
helics::CoreFactory::FindOrCreate(CoreType type,string_view coreName,int argc,char **argv)

{
  string_view name;
  string_view name_00;
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined4 in_register_0000003c;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *this;
  size_t unaff_R12;
  char *unaff_R13;
  string_view name_01;
  shared_ptr<helics::Core> sVar3;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  this = (__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)
         CONCAT44(in_register_0000003c,type);
  name_01._M_str = coreName._M_str;
  name._M_str = unaff_R13;
  name._M_len = unaff_R12;
  sVar3 = findCore(name);
  _Var2 = sVar3.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this->_M_ptr == (element_type *)0x0) {
    name_01._M_len = coreName._M_len & 0xffffffff;
    makeCore((CoreType)&local_40,name_01);
    std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=(this,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    (*this->_M_ptr->_vptr_Core[3])(this->_M_ptr,(ulong)argv & 0xffffffff);
    bVar1 = registerCore((shared_ptr<helics::Core> *)this,(CoreType)coreName._M_len);
    _Var2._M_pi = extraout_RDX;
    if (!bVar1) {
      name_00._M_str = unaff_R13;
      name_00._M_len = unaff_R12;
      findCore(name_00);
      std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=(this,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      _Var2._M_pi = extraout_RDX_00;
    }
  }
  sVar3.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi
  ;
  sVar3.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<helics::Core>)
         sVar3.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core> FindOrCreate(CoreType type, std::string_view coreName, int argc, char* argv[])
{
    std::shared_ptr<Core> core = findCore(coreName);
    if (core) {
        return core;
    }
    core = makeCore(type, coreName);

    core->configureFromArgs(argc, argv);
    if (!registerCore(core, type)) {
        core = findCore(coreName);
        if (core) {
            return core;
        }
    }

    return core;
}